

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O3

void Mini_LutPush(Mini_Lut_t *p,int nVars,int *pVars,uint *pTruth)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  int nCapMin;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  iVar8 = p->nSize;
  iVar1 = p->LutSize;
  uVar4 = 1 << ((byte)(iVar1 - 5U) & 0x1f);
  if (iVar1 < 6) {
    uVar4 = 1;
  }
  if (iVar8 == p->nCap) {
    if (0x3ffffffe < iVar8 * iVar1) {
      __assert_fail("p->LutSize*p->nSize < MINI_LUT_NULL/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                    ,0x5d,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
    }
    nCapMin = iVar8 * 2;
    if (iVar8 < 0xff) {
      nCapMin = 0xff;
    }
    Mini_LutGrow(p,nCapMin);
  }
  if (0 < nVars) {
    uVar6 = 0;
    do {
      if ((pVars[uVar6] < 0) || (p->nSize <= pVars[uVar6])) {
        __assert_fail("pVars[i] >= 0 && pVars[i] < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                      ,100,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
      }
      uVar6 = uVar6 + 1;
    } while ((uint)nVars != uVar6);
    if (0 < nVars) {
      piVar2 = p->pArray;
      uVar6 = 0;
      do {
        piVar2[(long)p->nSize * (long)p->LutSize + uVar6] = pVars[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nVars != uVar6);
      goto LAB_00782ebb;
    }
  }
  nVars = 0;
LAB_00782ebb:
  iVar8 = p->LutSize;
  if (nVars < iVar8) {
    piVar2 = p->pArray;
    lVar7 = (long)nVars;
    do {
      piVar2[(long)iVar8 * (long)p->nSize + lVar7] = 0x7fffffff;
      lVar7 = lVar7 + 1;
      iVar8 = p->LutSize;
    } while ((int)lVar7 < iVar8);
  }
  if (0 < (int)uVar4) {
    uVar5 = 0;
    puVar3 = p->pTruths;
    uVar6 = (ulong)(iVar1 - 5U);
    if (iVar1 < 6) {
      uVar6 = uVar5;
    }
    do {
      uVar9 = 0;
      if (pTruth != (uint *)0x0) {
        uVar9 = pTruth[uVar5];
      }
      puVar3[(long)(p->nSize << ((byte)uVar6 & 0x1f)) + uVar5] = uVar9;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  p->nSize = p->nSize + 1;
  return;
}

Assistant:

static void Mini_LutPush( Mini_Lut_t * p, int nVars, int * pVars, unsigned * pTruth )
{
    int i, nWords = Mini_LutWordNum(p->LutSize);
    if ( p->nSize == p->nCap )
    {
        assert( p->LutSize*p->nSize < MINI_LUT_NULL/2 );
        if ( p->nCap < MINI_LUT_START_SIZE )
            Mini_LutGrow( p, MINI_LUT_START_SIZE );
        else
            Mini_LutGrow( p, 2 * p->nCap );
    }
    for ( i = 0; i < nVars; i++ )
        assert( pVars[i] >= 0 && pVars[i] < p->nSize );
    for ( i = 0; i < nVars; i++ )
        p->pArray[p->LutSize * p->nSize + i] = pVars[i];
    for ( ; i < p->LutSize; i++ )
        p->pArray[p->LutSize * p->nSize + i] = MINI_LUT_NULL;
    for ( i = 0; i < nWords; i++ )
        p->pTruths[nWords * p->nSize + i] = pTruth? pTruth[i] : 0;
    p->nSize++;
}